

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::ReportLastSystemError(char *msg)

{
  char *m1;
  string local_68 [55];
  allocator local_31;
  string local_30 [8];
  string m;
  char *msg_local;
  
  m.field_2._8_8_ = msg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,msg,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::operator+=(local_30,": System Error: ");
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  std::__cxx11::string::operator+=(local_30,local_68);
  std::__cxx11::string::~string(local_68);
  m1 = (char *)std::__cxx11::string::c_str();
  Error(m1,(char *)0x0,(char *)0x0,(char *)0x0);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void cmSystemTools::ReportLastSystemError(const char* msg)
{
  std::string m = msg;
  m += ": System Error: ";
  m += Superclass::GetLastSystemError();
  cmSystemTools::Error(m.c_str());
}